

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::internal::UnitTestImpl::~UnitTestImpl(UnitTestImpl *this)

{
  pointer ppTVar1;
  pointer ppEVar2;
  DeathTestFactory *pDVar3;
  TestEventRepeater *pTVar4;
  pointer piVar5;
  pointer pcVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  pointer ppTVar8;
  pointer ppEVar9;
  
  this->_vptr_UnitTestImpl = (_func_int **)&PTR__UnitTestImpl_004f01c0;
  ppTVar1 = (this->test_suites_).
            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppTVar8 = (this->test_suites_).
                 super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppTVar8 != ppTVar1; ppTVar8 = ppTVar8 + 1
      ) {
    if (*ppTVar8 != (TestSuite *)0x0) {
      (*(*ppTVar8)->_vptr_TestSuite[1])();
    }
  }
  ppEVar2 = (this->environments_).
            super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppEVar9 = (this->environments_).
                 super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppEVar9 != ppEVar2;
      ppEVar9 = ppEVar9 + 1) {
    if (*ppEVar9 != (Environment *)0x0) {
      (**(code **)(*(long *)*ppEVar9 + 8))();
    }
  }
  if (this->os_stack_trace_getter_ != (OsStackTraceGetterInterface *)0x0) {
    (*this->os_stack_trace_getter_->_vptr_OsStackTraceGetterInterface[1])();
  }
  ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
  ::~ThreadLocal(&this->gtest_trace_stack_);
  pDVar3 = (this->death_test_factory_)._M_t.
           super___uniq_ptr_impl<testing::internal::DeathTestFactory,_std::default_delete<testing::internal::DeathTestFactory>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::DeathTestFactory_*,_std::default_delete<testing::internal::DeathTestFactory>_>
           .super__Head_base<0UL,_testing::internal::DeathTestFactory_*,_false>._M_head_impl;
  if (pDVar3 != (DeathTestFactory *)0x0) {
    (*pDVar3->_vptr_DeathTestFactory[1])();
  }
  (this->death_test_factory_)._M_t.
  super___uniq_ptr_impl<testing::internal::DeathTestFactory,_std::default_delete<testing::internal::DeathTestFactory>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::DeathTestFactory_*,_std::default_delete<testing::internal::DeathTestFactory>_>
  .super__Head_base<0UL,_testing::internal::DeathTestFactory_*,_false>._M_head_impl =
       (DeathTestFactory *)0x0;
  std::
  unique_ptr<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
  ::~unique_ptr(&this->internal_run_death_test_flag_);
  pTVar4 = (this->listeners_).repeater_;
  if (pTVar4 != (TestEventRepeater *)0x0) {
    (*(pTVar4->super_TestEventListener)._vptr_TestEventListener[1])();
  }
  std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>::~vector
            (&(this->ad_hoc_test_result_).test_properties_);
  std::vector<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>::~vector
            (&(this->ad_hoc_test_result_).test_part_results_);
  Mutex::~Mutex(&(this->ad_hoc_test_result_).test_properties_mutex_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->ignored_parameterized_test_suites_)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>_>_>
               *)&this->type_parameterized_test_registry_);
  ParameterizedTestSuiteRegistry::~ParameterizedTestSuiteRegistry
            (&this->parameterized_test_registry_);
  piVar5 = (this->test_suite_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar5 != (pointer)0x0) {
    operator_delete(piVar5,(long)(this->test_suite_indices_).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar5);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::TestSuite_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::TestSuite_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->test_suites_by_name_)._M_h);
  ppTVar8 = (this->test_suites_).
            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppTVar8 != (pointer)0x0) {
    operator_delete(ppTVar8,(long)(this->test_suites_).
                                  super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppTVar8
                   );
  }
  ppEVar9 = (this->environments_).
            super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppEVar9 != (pointer)0x0) {
    operator_delete(ppEVar9,(long)(this->environments_).
                                  super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppEVar9
                   );
  }
  ThreadLocal<testing::TestPartResultReporterInterface_*>::~ThreadLocal
            (&this->per_thread_test_part_result_reporter_);
  Mutex::~Mutex(&this->global_test_part_result_reporter_mutex_);
  pcVar6 = (this->original_working_dir_).pathname_._M_dataplus._M_p;
  paVar7 = &(this->original_working_dir_).pathname_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar6 != paVar7) {
    operator_delete(pcVar6,paVar7->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

UnitTestImpl::~UnitTestImpl() {
  // Deletes every TestSuite.
  ForEach(test_suites_, internal::Delete<TestSuite>);

  // Deletes every Environment.
  ForEach(environments_, internal::Delete<Environment>);

  delete os_stack_trace_getter_;
}